

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MasterSystem.cpp
# Opt level: O2

void __thiscall
Sega::MasterSystem::ConcreteMachine<(Analyser::Static::Sega::Target::Model)0>::ConcreteMachine
          (ConcreteMachine<(Analyser::Static::Sega::Target::Model)0> *this,Target *target,
          ROMFetcher *rom_fetcher)

{
  AsyncTaskQueue<false,_true,_void> *this_00;
  OPLL *this_01;
  CompoundSource<TI::SN76489,_Yamaha::OPL::OPLL> *this_02;
  pointer psVar1;
  PagingScheme PVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar3;
  Joystick *pJVar4;
  uint8_t **ppuVar5;
  iterator iVar6;
  ostream *poVar7;
  size_t address;
  ulong uVar8;
  size_t __n;
  Name name;
  initializer_list<Inputs::Keyboard::Key> __l;
  allocator_type local_fa;
  less<Inputs::Keyboard::Key> local_f9;
  vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
  *local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_f0;
  Keyboard *local_e8;
  LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_Yamaha::OPL::OPLL>_>,_false>
  *local_e0;
  Name bios_name;
  undefined4 uStack_d4;
  CompoundSource<TI::SN76489,_Yamaha::OPL::OPLL> *local_d0;
  OPLL *local_c8;
  AsyncTaskQueue<false,_true,_void> *local_c0;
  JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *local_b8;
  Processor<Sega::MasterSystem::ConcreteMachine<(Analyser::Static::Sega::Target::Model)0>,_false,_false>
  *local_b0;
  ROMFetcher *local_a8;
  double local_a0;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  Request request;
  
  (this->super_TimedMachine).clock_rate_ = 1.0;
  (this->super_TimedMachine).clock_conversion_error_ = 0.0;
  (this->super_TimedMachine).speed_multiplier_ = 1.0;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_005870a0;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00587128;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_00587170;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_005871a8;
  (this->super_KeyboardMachine).super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_005871c0;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_00587200;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_00587218;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&PTR_keyboard_did_change_key_00587238;
  PVar2 = target->paging_scheme;
  this->region_ = target->region;
  this->paging_scheme_ = PVar2;
  local_b0 = &this->z80_;
  CPU::Z80::
  Processor<Sega::MasterSystem::ConcreteMachine<(Analyser::Static::Sega::Target::Model)0>,_false,_false>
  ::Processor(local_b0,this);
  JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::JustInTimeActor<>
            (&this->vdp_);
  this_00 = &this->audio_queue_;
  local_b8 = &this->vdp_;
  local_a8 = rom_fetcher;
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(this_00);
  local_c0 = this_00;
  TI::SN76489::SN76489(&this->sn76489_,(uint)(target->model != SG1000) * 2,this_00,1);
  this_01 = &this->opll_;
  Yamaha::OPL::OPLL::OPLL(this_01,this_00,1,false);
  this_02 = &this->mixer_;
  local_c8 = this_01;
  Outputs::Speaker::CompoundSource<TI::SN76489,_Yamaha::OPL::OPLL>::CompoundSource
            (this_02,&this->sn76489_,this_01);
  local_e0 = &(this->speaker_).
              super_LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_Yamaha::OPL::OPLL>_>,_false>
  ;
  local_d0 = this_02;
  Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_Yamaha::OPL::OPLL>_>::
  PullLowpass((PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_Yamaha::OPL::OPLL>_> *)
              local_e0,this_02);
  this->opll_detection_word_ = 0xff;
  local_f8 = (vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
              *)&this->joysticks_;
  (this->joysticks_).
  super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->joysticks_).
  super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->joysticks_).
  super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _bios_name = 0x39;
  __l._M_len = 2;
  __l._M_array = &bios_name;
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::set((set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
         *)&roms,__l,&local_f9,&local_fa);
  local_e8 = &this->keyboard_;
  request.node.children.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)&request.node.is_optional;
  request.node.type = Any;
  request.node.name = None;
  request.node.is_optional = false;
  request.node._9_7_ = 0;
  request.node.children.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  request.node.children.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       request.node.children.
       super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
       super__Vector_impl_data._M_finish;
  Inputs::Keyboard::Keyboard
            (local_e8,(set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
                       *)&roms,
             (set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
              *)&request);
  std::
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~_Rb_tree((_Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
               *)&request);
  std::
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~_Rb_tree((_Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
               *)&roms);
  this->reset_is_pressed_ = false;
  this->pause_is_pressed_ = false;
  (this->cartridge_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cartridge_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cartridge_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->time_since_sn76489_update_).super_WrappedInt<HalfCycles>.length_ = 0;
  (this->time_until_debounce_).super_WrappedInt<HalfCycles>.length_ = 0;
  this->io_port_control_ = '\x0f';
  this->paging_registers_[0] = '\0';
  this->paging_registers_[1] = '\x01';
  this->paging_registers_[2] = '\x02';
  this->memory_control_ = '\0';
  this->has_bios_ = true;
  local_a0 = *(double *)(&DAT_004662c0 + (ulong)(target->region == Europe) * 8);
  local_f0 = &this->cartridge_;
  Outputs::Speaker::
  LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_Yamaha::OPL::OPLL>_>,_false>
  ::set_input_rate(local_e0,(float)local_a0);
  (this->super_TimedMachine).clock_rate_ = local_a0;
  pJVar4 = (Joystick *)operator_new(0x48);
  MasterSystem::Joystick::Joystick(pJVar4);
  roms._M_t._M_impl._0_8_ = pJVar4;
  std::
  vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
  ::emplace_back<Sega::MasterSystem::Joystick*>(local_f8,(Joystick **)&roms);
  pJVar4 = (Joystick *)operator_new(0x48);
  MasterSystem::Joystick::Joystick(pJVar4);
  roms._M_t._M_impl._0_8_ = pJVar4;
  std::
  vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
  ::emplace_back<Sega::MasterSystem::Joystick*>(local_f8,(Joystick **)&roms);
  ppuVar5 = this->read_pointers_;
  for (uVar8 = 0; uVar8 < 0x10000; uVar8 = uVar8 + 0x400) {
    *ppuVar5 = (uint8_t *)0x0;
    ppuVar5 = ppuVar5 + 1;
  }
  ppuVar5 = this->write_pointers_;
  for (uVar8 = 0; uVar8 < 0x10000; uVar8 = uVar8 + 0x400) {
    *ppuVar5 = (uint8_t *)0x0;
    ppuVar5 = ppuVar5 + 1;
  }
  psVar1 = (target->super_Target).media.cartridges.
           super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar1 != (target->super_Target).media.cartridges.
                super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->cartridge_,
               &((((psVar1->
                   super___shared_ptr<Storage::Cartridge::Cartridge,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->segments_).
                 super__Vector_base<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
                 ._M_impl.super__Vector_impl_data._M_start)->data);
  }
  pvVar3 = local_f0;
  uVar8 = (long)(this->cartridge_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->cartridge_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (uVar8 < 0xc000) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(local_f0,0xc000);
    memset((pvVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start + uVar8,0xff,0xc000 - uVar8);
  }
  if (this->paging_scheme_ == Codemasters) {
    this->paging_registers_[0] = '\0';
    this->paging_registers_[1] = '\x01';
    this->paging_registers_[2] = '\0';
  }
  name = MasterSystemWesternBIOS - (target->region == Japan);
  _bios_name = CONCAT44(uStack_d4,name);
  ROM::Request::Request(&request,name,true);
  std::
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  ::operator()(&roms,local_a8,&request);
  ROM::Request::validate(&request,&roms);
  iVar6 = std::
          _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::find(&roms._M_t,&bios_name);
  if ((_Rb_tree_header *)iVar6._M_node == &roms._M_t._M_impl.super__Rb_tree_header) {
    this->has_bios_ = false;
    this->memory_control_ = this->memory_control_ | 8;
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "No BIOS found; attempting to start cartridge directly");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  else {
    this->has_bios_ = true;
    __n = (long)iVar6._M_node[1]._M_left - (long)iVar6._M_node[1]._M_parent;
    if (0x1fff < __n) {
      __n = 0x2000;
    }
    memcpy(this->bios_,iVar6._M_node[1]._M_parent,__n);
  }
  page_cartridge(this);
  ppuVar5 = this->read_pointers_ + 0x30;
  for (uVar8 = 0xc000; uVar8 < 0x10000; uVar8 = uVar8 + 0x400) {
    *ppuVar5 = this->ram_;
    ppuVar5 = ppuVar5 + 1;
  }
  ppuVar5 = this->write_pointers_ + 0x30;
  for (uVar8 = 0xc000; uVar8 < 0x10000; uVar8 = uVar8 + 0x400) {
    *ppuVar5 = this->ram_;
    ppuVar5 = ppuVar5 + 1;
  }
  set_mixer_levels(this,'\0');
  Inputs::Keyboard::set_delegate(local_e8,&this->super_Delegate);
  std::
  _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~_Rb_tree(&roms._M_t);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            (&request.node.children);
  return;
}

Assistant:

ConcreteMachine(const Analyser::Static::Sega::Target &target, const ROMMachine::ROMFetcher &rom_fetcher) :
			region_(target.region),
			paging_scheme_(target.paging_scheme),
			z80_(*this),
			sn76489_(
				(target.model == Target::Model::SG1000) ? TI::SN76489::Personality::SN76489 : TI::SN76489::Personality::SMS,
				audio_queue_,
				audio_divider),
			opll_(audio_queue_, audio_divider),
			mixer_(sn76489_, opll_),
			speaker_(mixer_),
			keyboard_({Inputs::Keyboard::Key::Enter, Inputs::Keyboard::Key::Escape}, {}) {
			// Pick the clock rate based on the region.
			const double clock_rate = target.region == Target::Region::Europe ? 3546893.0 : 3579540.0;
			speaker_.set_input_rate(float(clock_rate / audio_divider));
			set_clock_rate(clock_rate);

			// Instantiate the joysticks.
			joysticks_.emplace_back(new Joystick);
			joysticks_.emplace_back(new Joystick);

			// Clear the memory map.
			map(read_pointers_, nullptr, 0x10000, 0);
			map(write_pointers_, nullptr, 0x10000, 0);

			// Take a copy of the cartridge and place it into memory.
			if(!target.media.cartridges.empty()) {
				cartridge_ = target.media.cartridges[0]->get_segments()[0].data;
			}
			if(cartridge_.size() < 48*1024) {
				std::size_t new_space = 48*1024 - cartridge_.size();
				cartridge_.resize(48*1024);
				memset(&cartridge_[48*1024 - new_space], 0xff, new_space);
			}

			if(paging_scheme_ == Target::PagingScheme::Codemasters) {
				// The Codemasters cartridges start with pages 0, 1 and 0 again initially visible.
				paging_registers_[0] = 0;
				paging_registers_[1] = 1;
				paging_registers_[2] = 0;
			}

			// Load the BIOS if available.
			//
			// TODO: there's probably a million other versions of the Master System BIOS; try to build a
			// CRC32 catalogue of those. So far:
			//
			//	0072ed54 = US/European BIOS 1.3
			//	48d44a13 = Japanese BIOS 2.1
			const bool is_japanese = target.region == Target::Region::Japan;
			const ROM::Name bios_name = is_japanese ? ROM::Name::MasterSystemJapaneseBIOS : ROM::Name::MasterSystemWesternBIOS;
			ROM::Request request(bios_name, true);
			auto roms = rom_fetcher(request);
			request.validate(roms);

			const auto rom = roms.find(bios_name);
			if(rom == roms.end()) {
				// No BIOS found; attempt to boot as though it has already disabled itself.
				has_bios_ = false;
				memory_control_ |= 0x08;
				std::cerr << "No BIOS found; attempting to start cartridge directly" << std::endl;
			} else {
				has_bios_ = true;
				memcpy(&bios_, rom->second.data(), std::min(sizeof(bios_), rom->second.size()));
			}
			page_cartridge();

			// Map RAM.
			if constexpr (is_master_system(model)) {
				map(read_pointers_, ram_, 8*1024, 0xc000, 0x10000);
				map(write_pointers_, ram_, 8*1024, 0xc000, 0x10000);
			} else {
				map(read_pointers_, ram_, 1024, 0xc000, 0x10000);
				map(write_pointers_, ram_, 1024, 0xc000, 0x10000);
			}

			// Apply a relatively low low-pass filter. More guidance needed here.
			// TODO: this is disabled for now since it isn't applicable for the FM chip, I think.
//			speaker_.set_high_frequency_cutoff(8000);

			// Set default mixer levels: FM off, SN full-throttle.
			set_mixer_levels(0);

			keyboard_.set_delegate(this);
		}